

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_variable.cpp
# Opt level: O0

adios2_error adios2_selection_size(size_t *size,adios2_variable *variable)

{
  DataType DVar1;
  DataType DVar2;
  undefined8 uVar3;
  long in_RSI;
  undefined8 *in_RDI;
  Variable<std::complex<double>_> *variable_15;
  Variable<std::complex<float>_> *variable_14;
  Variable<long_double> *variable_13;
  Variable<double> *variable_12;
  Variable<float> *variable_11;
  Variable<unsigned_long> *variable_10;
  Variable<unsigned_int> *variable_9;
  Variable<unsigned_short> *variable_8;
  Variable<unsigned_char> *variable_7;
  Variable<long> *variable_6;
  Variable<int> *variable_5;
  Variable<short> *variable_4;
  Variable<signed_char> *variable_3;
  Variable<char> *variable_2;
  Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *variable_1;
  DataType typeCpp;
  VariableBase *variableBase;
  string *in_stack_fffffffffffffdc8;
  adios2_variable *in_stack_fffffffffffffdd0;
  allocator local_39;
  string local_38 [32];
  long local_18;
  undefined8 *local_10;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_38,"for adios2_variable, in call to adios2_selection_size",&local_39);
  adios2::helper::CheckForNullptr<adios2_variable_const>
            (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  DVar1 = *(DataType *)(local_18 + 0x28);
  if (DVar1 != Struct) {
    DVar2 = adios2::helper::GetDataType<std::__cxx11::string>();
    if (DVar1 == DVar2) {
      if (local_18 != 0) {
        __dynamic_cast(local_18,&adios2::core::VariableBase::typeinfo,
                       &adios2::core::Variable<std::__cxx11::string>::typeinfo,0);
      }
      uVar3 = adios2::core::Variable<std::__cxx11::string>::SelectionSize();
      *local_10 = uVar3;
    }
    else {
      DVar2 = adios2::helper::GetDataType<char>();
      if (DVar1 == DVar2) {
        if (local_18 != 0) {
          __dynamic_cast(local_18,&adios2::core::VariableBase::typeinfo,
                         &adios2::core::Variable<char>::typeinfo,0);
        }
        uVar3 = adios2::core::Variable<char>::SelectionSize();
        *local_10 = uVar3;
      }
      else {
        DVar2 = adios2::helper::GetDataType<signed_char>();
        if (DVar1 == DVar2) {
          if (local_18 != 0) {
            __dynamic_cast(local_18,&adios2::core::VariableBase::typeinfo,
                           &adios2::core::Variable<signed_char>::typeinfo,0);
          }
          uVar3 = adios2::core::Variable<signed_char>::SelectionSize();
          *local_10 = uVar3;
        }
        else {
          DVar2 = adios2::helper::GetDataType<short>();
          if (DVar1 == DVar2) {
            if (local_18 != 0) {
              __dynamic_cast(local_18,&adios2::core::VariableBase::typeinfo,
                             &adios2::core::Variable<short>::typeinfo,0);
            }
            uVar3 = adios2::core::Variable<short>::SelectionSize();
            *local_10 = uVar3;
          }
          else {
            DVar2 = adios2::helper::GetDataType<int>();
            if (DVar1 == DVar2) {
              if (local_18 != 0) {
                __dynamic_cast(local_18,&adios2::core::VariableBase::typeinfo,
                               &adios2::core::Variable<int>::typeinfo,0);
              }
              uVar3 = adios2::core::Variable<int>::SelectionSize();
              *local_10 = uVar3;
            }
            else {
              DVar2 = adios2::helper::GetDataType<long>();
              if (DVar1 == DVar2) {
                if (local_18 != 0) {
                  __dynamic_cast(local_18,&adios2::core::VariableBase::typeinfo,
                                 &adios2::core::Variable<long>::typeinfo,0);
                }
                uVar3 = adios2::core::Variable<long>::SelectionSize();
                *local_10 = uVar3;
              }
              else {
                DVar2 = adios2::helper::GetDataType<unsigned_char>();
                if (DVar1 == DVar2) {
                  if (local_18 != 0) {
                    __dynamic_cast(local_18,&adios2::core::VariableBase::typeinfo,
                                   &adios2::core::Variable<unsigned_char>::typeinfo,0);
                  }
                  uVar3 = adios2::core::Variable<unsigned_char>::SelectionSize();
                  *local_10 = uVar3;
                }
                else {
                  DVar2 = adios2::helper::GetDataType<unsigned_short>();
                  if (DVar1 == DVar2) {
                    if (local_18 != 0) {
                      __dynamic_cast(local_18,&adios2::core::VariableBase::typeinfo,
                                     &adios2::core::Variable<unsigned_short>::typeinfo,0);
                    }
                    uVar3 = adios2::core::Variable<unsigned_short>::SelectionSize();
                    *local_10 = uVar3;
                  }
                  else {
                    DVar2 = adios2::helper::GetDataType<unsigned_int>();
                    if (DVar1 == DVar2) {
                      if (local_18 != 0) {
                        __dynamic_cast(local_18,&adios2::core::VariableBase::typeinfo,
                                       &adios2::core::Variable<unsigned_int>::typeinfo,0);
                      }
                      uVar3 = adios2::core::Variable<unsigned_int>::SelectionSize();
                      *local_10 = uVar3;
                    }
                    else {
                      DVar2 = adios2::helper::GetDataType<unsigned_long>();
                      if (DVar1 == DVar2) {
                        if (local_18 != 0) {
                          __dynamic_cast(local_18,&adios2::core::VariableBase::typeinfo,
                                         &adios2::core::Variable<unsigned_long>::typeinfo,0);
                        }
                        uVar3 = adios2::core::Variable<unsigned_long>::SelectionSize();
                        *local_10 = uVar3;
                      }
                      else {
                        DVar2 = adios2::helper::GetDataType<float>();
                        if (DVar1 == DVar2) {
                          if (local_18 != 0) {
                            __dynamic_cast(local_18,&adios2::core::VariableBase::typeinfo,
                                           &adios2::core::Variable<float>::typeinfo,0);
                          }
                          uVar3 = adios2::core::Variable<float>::SelectionSize();
                          *local_10 = uVar3;
                        }
                        else {
                          DVar2 = adios2::helper::GetDataType<double>();
                          if (DVar1 == DVar2) {
                            if (local_18 != 0) {
                              __dynamic_cast(local_18,&adios2::core::VariableBase::typeinfo,
                                             &adios2::core::Variable<double>::typeinfo,0);
                            }
                            uVar3 = adios2::core::Variable<double>::SelectionSize();
                            *local_10 = uVar3;
                          }
                          else {
                            DVar2 = adios2::helper::GetDataType<long_double>();
                            if (DVar1 == DVar2) {
                              if (local_18 != 0) {
                                __dynamic_cast(local_18,&adios2::core::VariableBase::typeinfo,
                                               &adios2::core::Variable<long_double>::typeinfo,0);
                              }
                              uVar3 = adios2::core::Variable<long_double>::SelectionSize();
                              *local_10 = uVar3;
                            }
                            else {
                              DVar2 = adios2::helper::GetDataType<std::complex<float>>();
                              if (DVar1 == DVar2) {
                                if (local_18 != 0) {
                                  __dynamic_cast(local_18,&adios2::core::VariableBase::typeinfo,
                                                 &adios2::core::Variable<std::complex<float>>::
                                                  typeinfo,0);
                                }
                                uVar3 = adios2::core::Variable<std::complex<float>>::SelectionSize()
                                ;
                                *local_10 = uVar3;
                              }
                              else {
                                DVar2 = adios2::helper::GetDataType<std::complex<double>>();
                                if (DVar1 == DVar2) {
                                  if (local_18 != 0) {
                                    __dynamic_cast(local_18,&adios2::core::VariableBase::typeinfo,
                                                   &adios2::core::Variable<std::complex<double>>::
                                                    typeinfo,0);
                                  }
                                  uVar3 = adios2::core::Variable<std::complex<double>>::
                                          SelectionSize();
                                  *local_10 = uVar3;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return adios2_error_none;
}

Assistant:

adios2_error adios2_selection_size(size_t *size, const adios2_variable *variable)
{
    try
    {
        adios2::helper::CheckForNullptr(variable, "for adios2_variable, in call to "
                                                  "adios2_selection_size");
        const adios2::core::VariableBase *variableBase =
            reinterpret_cast<const adios2::core::VariableBase *>(variable);

        const adios2::DataType typeCpp = variableBase->m_Type;

        if (typeCpp == adios2::DataType::Struct)
        {
            // not supported
        }
#define declare_template_instantiation(T)                                                          \
    else if (typeCpp == adios2::helper::GetDataType<T>())                                          \
    {                                                                                              \
        const adios2::core::Variable<T> *variable =                                                \
            dynamic_cast<const adios2::core::Variable<T> *>(variableBase);                         \
        *size = variable->SelectionSize();                                                         \
    }
        ADIOS2_FOREACH_STDTYPE_1ARG(declare_template_instantiation)
#undef declare_template_instantiation

        return adios2_error_none;
    }
    catch (...)
    {
        return static_cast<adios2_error>(adios2::helper::ExceptionToError("adios2_selection_size"));
    }
}